

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetPipelineStateStatusString
                 (PIPELINE_STATE_STATUS PipelineStatus,bool GetEnumString)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  bool GetEnumString_local;
  char *pcStack_10;
  PIPELINE_STATE_STATUS PipelineStatus_local;
  
  switch(PipelineStatus) {
  case PIPELINE_STATE_STATUS_UNINITIALIZED:
    pcStack_10 = "Uninitialized";
    if (GetEnumString) {
      pcStack_10 = "PIPELINE_STATE_STATUS_UNINITIALIZED";
    }
    break;
  case PIPELINE_STATE_STATUS_COMPILING:
    pcStack_10 = "Compiling";
    if (GetEnumString) {
      pcStack_10 = "PIPELINE_STATE_STATUS_COMPILING";
    }
    break;
  case PIPELINE_STATE_STATUS_READY:
    pcStack_10 = "Ready";
    if (GetEnumString) {
      pcStack_10 = "PIPELINE_STATE_STATUS_READY";
    }
    break;
  case PIPELINE_STATE_STATUS_FAILED:
    pcStack_10 = "Failed";
    if (GetEnumString) {
      pcStack_10 = "PIPELINE_STATE_STATUS_FAILED";
    }
    break;
  default:
    msg.field_2._M_local_buf[0xb] = GetEnumString;
    msg.field_2._12_4_ = PipelineStatus;
    FormatString<char[33]>((string *)local_38,(char (*) [33])"Unexpected pipeline state status");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetPipelineStateStatusString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x9fe);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

const Char* GetPipelineStateStatusString(PIPELINE_STATE_STATUS PipelineStatus, bool GetEnumString)
{
    switch (PipelineStatus)
    {
        // clang-format off
        case PIPELINE_STATE_STATUS_UNINITIALIZED: return GetEnumString ? "PIPELINE_STATE_STATUS_UNINITIALIZED" : "Uninitialized";
        case PIPELINE_STATE_STATUS_COMPILING:     return GetEnumString ? "PIPELINE_STATE_STATUS_COMPILING"     : "Compiling";
        case PIPELINE_STATE_STATUS_READY: 	      return GetEnumString ? "PIPELINE_STATE_STATUS_READY"         : "Ready";
        case PIPELINE_STATE_STATUS_FAILED: 	      return GetEnumString ? "PIPELINE_STATE_STATUS_FAILED"        : "Failed";
        // clang-format on
        default:
            UNEXPECTED("Unexpected pipeline state status");
            return "Unknown";
    }
}